

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int create_labelmap(string *file_name)

{
  code *pcVar1;
  bool bVar2;
  istream *piVar3;
  ostream *poVar4;
  string local_500 [32];
  string local_4e0 [32];
  long local_4c0;
  size_t pos;
  int local_498;
  int local_494;
  int pos_i;
  int pos_f;
  string local_470 [8];
  string line;
  string local_450 [8];
  ifstream myReadFile;
  ostream local_248 [8];
  ofstream outfile;
  allocator local_31;
  string local_30 [8];
  string outfile_name;
  string *file_name_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"/newdataset/obj.names",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::ofstream::ofstream(local_248,local_30,_S_out);
  std::ifstream::ifstream(local_450);
  std::ifstream::open(local_450,(_Ios_Openmode)file_name);
  std::__cxx11::string::string(local_470);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_450,local_470);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar2) break;
    std::__cxx11::string::substr((ulong)&pos_i,(ulong)local_470);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &pos_i,"item {");
    std::__cxx11::string::~string((string *)&pos_i);
    if (bVar2) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_450,local_470)
      ;
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_450,local_470)
      ;
      local_498 = 8;
      std::__cxx11::string::substr((ulong)&pos,(ulong)local_470);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &pos,"name: ");
      std::__cxx11::string::~string((string *)&pos);
      if (bVar2) {
        local_4c0 = std::__cxx11::string::find((char *)local_470,0x109112);
        while (local_4c0 != -1) {
          local_494 = (int)local_4c0 - local_498;
          local_4c0 = std::__cxx11::string::find((char *)local_470,0x109112);
        }
        std::__cxx11::string::substr((ulong)local_4e0,(ulong)local_470);
        poVar4 = std::operator<<((ostream *)&std::cout,local_4e0);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_4e0);
        std::__cxx11::string::substr((ulong)local_500,(ulong)local_470);
        std::operator<<(local_248,local_500);
        std::__cxx11::string::~string(local_500);
        poVar4 = std::operator<<((ostream *)&std::cout,local_30);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(local_248,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  std::__cxx11::string::~string(local_470);
  std::ofstream::close();
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int create_labelmap(string file_name)
{

    string outfile_name = objnames;
    //string outfile_name = labels_voc.substr(0, labels_voc.size()-9) + "obj.names";
    //cout << outfile_name << endl;

    std::ofstream outfile (outfile_name, std::ofstream::out);

    ifstream myReadFile;
    myReadFile.open(file_name);

    for( std::string line; getline( myReadFile, line ); )
    {
        if (line.substr(0,6) == "item {")
        {
            getline( myReadFile, line );
            getline( myReadFile, line );

            int pos_f, pos_i =8;
            if (line.substr(1,6) == "name: ")
            {
                // Find delimiter '
                for(size_t pos=line.find("'",0); pos!=std::string::npos; pos=line.find("'",pos+1))
                    pos_f = pos-pos_i;

                cout << line.substr(pos_i,pos_f) << endl;
                outfile << line.substr(pos_i,pos_f);
                cout << outfile_name << endl;
                outfile << endl;
            }
        }
    }
    outfile.close();
}